

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

RangeDynamicLayerParams * __thiscall
CoreML::Specification::RangeDynamicLayerParams::New(RangeDynamicLayerParams *this,Arena *arena)

{
  RangeDynamicLayerParams *this_00;
  
  this_00 = (RangeDynamicLayerParams *)operator_new(0x20);
  RangeDynamicLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RangeDynamicLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

RangeDynamicLayerParams* RangeDynamicLayerParams::New(::google::protobuf::Arena* arena) const {
  RangeDynamicLayerParams* n = new RangeDynamicLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}